

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

void google::protobuf::Option::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  ulong uVar2;
  _func_int **pp_Var3;
  string *psVar4;
  Arena *arena;
  string *value;
  Arena *arena_00;
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    psVar4 = (string *)0x0;
  }
  if (psVar4 == (string *)0x0) {
    value = (string *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if (value->_M_string_length != 0) {
      arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>((ArenaStringPtr *)&to_msg[1]._internal_metadata_,value,arena);
    }
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 1) != 0) {
      from_msg_00 = (MessageLite *)from_msg[2]._vptr_MessageLite;
      if (from_msg_00 == (MessageLite *)0x0) {
        MergeImpl((Option *)&stack0xffffffffffffffd0);
        goto LAB_001c0a7b;
      }
      if ((MessageLite *)to_msg[2]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var3 = (_func_int **)Arena::CopyConstruct<google::protobuf::Any>(arena_00,from_msg_00);
        to_msg[2]._vptr_MessageLite = pp_Var3;
      }
      else {
        Any::MergeImpl((MessageLite *)to_msg[2]._vptr_MessageLite,from_msg_00);
      }
    }
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar2 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar2 & 1) == 0) {
      return;
    }
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_001c0a7b:
  MergeImpl();
  return;
}

Assistant:

void Option::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Option*>(&to_msg);
  auto& from = static_cast<const Option&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Option)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_name().empty()) {
    _this->_internal_set_name(from._internal_name());
  }
  cached_has_bits = from._impl_._has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    ABSL_DCHECK(from._impl_.value_ != nullptr);
    if (_this->_impl_.value_ == nullptr) {
      _this->_impl_.value_ =
          ::google::protobuf::Message::CopyConstruct<::google::protobuf::Any>(arena, *from._impl_.value_);
    } else {
      _this->_impl_.value_->MergeFrom(*from._impl_.value_);
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}